

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall QTabBarPrivate::layoutTabs(QTabBarPrivate *this)

{
  Tab *pTVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  LayoutDirection LVar5;
  int iVar6;
  QTabBar *pQVar7;
  QStyle *pQVar8;
  reference pQVar9;
  qsizetype qVar10;
  const_reference ppTVar11;
  int *piVar12;
  QWidget *widget;
  QTabBar *pQVar13;
  QTabBarPrivate *in_RDI;
  long in_FS_OFFSET;
  int scrollButtonWidth;
  QTabBar *q_1;
  QLayoutStruct *lstruct;
  Tab *tab_2;
  int i_2;
  Tab *tab_1;
  int i_1;
  int y;
  int miny;
  Tab *tab;
  int i;
  int x;
  int minx;
  int hiddenTabs;
  int tabChainIndex;
  bool vertTabs;
  int maxExtent;
  QTabBar *q;
  QRect scrollButtonRightRect;
  QRect scrollButtonLeftRect;
  QRect scrollRect;
  QSize sz_1;
  int maxWidth;
  QSize sz;
  int maxHeight;
  QList<QLayoutStruct> tabChain;
  Alignment tabAlignment;
  int available;
  int last;
  QSize size;
  QStyleOption opt;
  int in_stack_fffffffffffffdc8;
  int iVar14;
  int in_stack_fffffffffffffdcc;
  QRect *in_stack_fffffffffffffdd0;
  QStyleOption *this_00;
  int in_stack_fffffffffffffdd8;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_fffffffffffffddc;
  undefined1 uVar15;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 uVar16;
  uint in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  int in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  int in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  bool local_1ad;
  int in_stack_fffffffffffffe54;
  QTabBarPrivate *in_stack_fffffffffffffe58;
  int local_18c;
  int local_17c;
  int local_174;
  int local_164;
  int local_15c;
  undefined1 in_stack_fffffffffffffee8 [16];
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined8 local_f0;
  undefined8 local_e8;
  int local_d8;
  undefined8 local_d4;
  undefined8 local_cc;
  undefined1 *local_c4;
  int local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  int local_a0;
  undefined8 local_9c;
  undefined8 local_94;
  undefined1 *local_8c;
  int local_84;
  undefined4 local_80;
  undefined4 local_7c;
  QList<QLayoutStruct> local_78;
  QFlag local_60;
  undefined4 local_5c;
  int local_58;
  int local_54;
  QSize local_50;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = q_func(in_RDI);
  *(ushort *)&in_RDI->field_0x2d0 = *(ushort *)&in_RDI->field_0x2d0 & 0xfffe;
  local_50 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_50 = QWidget::size((QWidget *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
  ;
  local_54 = -0x55555556;
  local_58 = -0x55555556;
  bVar2 = verticalTabs(in_RDI->shape);
  local_5c = 0xaaaaaaaa;
  pQVar8 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  iVar4 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,5,0,pQVar7);
  QFlag::QFlag(&local_60,iVar4);
  QFlags<Qt::AlignmentFlag>::QFlagsStorageHelper
            ((QFlags<Qt::AlignmentFlag> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
             (QFlag)(int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (QLayoutStruct *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTabBarPrivate::Tab_*>::size(&in_RDI->tabList);
  QList<QLayoutStruct>::QList
            ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  pQVar9 = QList<QLayoutStruct>::operator[]
                     ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                      CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  QLayoutStruct::init(pQVar9,(EVP_PKEY_CTX *)0x0);
  local_1ad = false;
  if ((*(ushort *)&in_RDI->field_0x2d0 >> 5 & 1) == 0) {
    local_7c = local_5c;
    bVar3 = ::operator!=((QFlags<Qt::AlignmentFlag>)in_stack_fffffffffffffddc.i,
                         (AlignmentFlag)in_stack_fffffffffffffdd0);
    local_1ad = false;
    if (bVar3) {
      local_80 = local_5c;
      local_1ad = ::operator!=((QFlags<Qt::AlignmentFlag>)in_stack_fffffffffffffddc.i,
                               (AlignmentFlag)in_stack_fffffffffffffdd0);
    }
  }
  pQVar9 = QList<QLayoutStruct>::operator[]
                     ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                      CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  pQVar9->expansive = local_1ad;
  pQVar9 = QList<QLayoutStruct>::operator[]
                     ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                      CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  pQVar9->empty = true;
  if (bVar2) {
    local_174 = 0;
    local_bc = 0;
    for (local_17c = 0; qVar10 = QList<QTabBarPrivate::Tab_*>::size(&in_RDI->tabList),
        local_17c < qVar10; local_17c = local_17c + 1) {
      ppTVar11 = QList<QTabBarPrivate::Tab_*>::at
                           ((QList<QTabBarPrivate::Tab_*> *)in_stack_fffffffffffffdd0,
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      pTVar1 = *ppTVar11;
      if (((byte)pTVar1->field_0xe4 >> 1 & 1) != 0) {
        local_c4 = &DAT_aaaaaaaaaaaaaaaa;
        local_c4 = (undefined1 *)
                   (**(code **)(*(long *)&pQVar7->super_QWidget + 0x1a0))(pQVar7,local_17c);
        QSize::width((QSize *)0x6aa12f);
        QSize::height((QSize *)0x6aa140);
        QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffddc.i,in_stack_fffffffffffffdd8),
                     (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),(int)in_stack_fffffffffffffdd0,
                     in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8);
        (pTVar1->maxRect).x1 = (Representation)(undefined4)local_d4;
        (pTVar1->maxRect).y1 = (Representation)local_d4._4_4_;
        (pTVar1->maxRect).x2 = (Representation)(undefined4)local_cc;
        (pTVar1->maxRect).y2 = (Representation)local_cc._4_4_;
        QSize::height((QSize *)0x6aa18d);
        local_d8 = QSize::width((QSize *)0x6aa1a8);
        piVar12 = qMax<int>(&local_bc,&local_d8);
        local_bc = *piVar12;
        local_c4 = (undefined1 *)
                   (**(code **)(*(long *)&pQVar7->super_QWidget + 0x1a8))(pQVar7,local_17c);
        in_stack_fffffffffffffe00 = local_174;
        in_stack_fffffffffffffe04 = QSize::width((QSize *)0x6aa215);
        QSize::height((QSize *)0x6aa226);
        QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffddc.i,in_stack_fffffffffffffdd8),
                     (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),(int)in_stack_fffffffffffffdd0,
                     in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8);
        (pTVar1->minRect).x1 = (Representation)(undefined4)local_f0;
        (pTVar1->minRect).y1 = (Representation)local_f0._4_4_;
        (pTVar1->minRect).x2 = (Representation)(undefined4)local_e8;
        (pTVar1->minRect).y2 = (Representation)local_e8._4_4_;
        iVar4 = QSize::height((QSize *)0x6aa270);
        local_174 = iVar4 + local_174;
        pQVar9 = QList<QLayoutStruct>::operator[]
                           ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        QLayoutStruct::init(pQVar9,(EVP_PKEY_CTX *)0x0);
        in_stack_fffffffffffffe08 =
             QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        pQVar9 = QList<QLayoutStruct>::operator[]
                           ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        pQVar9->sizeHint = in_stack_fffffffffffffe08;
        in_stack_fffffffffffffe0c = QSize::height((QSize *)0x6aa2e0);
        pQVar9 = QList<QLayoutStruct>::operator[]
                           ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        pQVar9->minimumSize = in_stack_fffffffffffffe0c;
        pQVar9 = QList<QLayoutStruct>::operator[]
                           ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        pQVar9->empty = false;
        pQVar9 = QList<QLayoutStruct>::operator[]
                           ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        pQVar9->expansive = true;
        if ((*(ushort *)&in_RDI->field_0x2d0 >> 5 & 1) == 0) {
          pQVar9 = QList<QLayoutStruct>::operator[]
                             ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                              CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          in_stack_fffffffffffffdf4 = pQVar9->sizeHint;
          pQVar9 = QList<QLayoutStruct>::operator[]
                             ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                              CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          pQVar9->maximumSize = in_stack_fffffffffffffdf4;
        }
      }
    }
    local_54 = local_174;
    local_58 = QSize::height((QSize *)0x6aa3cc);
  }
  else {
    local_15c = 0;
    local_84 = 0;
    for (local_164 = 0; qVar10 = QList<QTabBarPrivate::Tab_*>::size(&in_RDI->tabList),
        local_164 < qVar10; local_164 = local_164 + 1) {
      ppTVar11 = QList<QTabBarPrivate::Tab_*>::at
                           ((QList<QTabBarPrivate::Tab_*> *)in_stack_fffffffffffffdd0,
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      pTVar1 = *ppTVar11;
      if (((byte)pTVar1->field_0xe4 >> 1 & 1) != 0) {
        local_8c = &DAT_aaaaaaaaaaaaaaaa;
        local_8c = (undefined1 *)
                   (**(code **)(*(long *)&pQVar7->super_QWidget + 0x1a0))(pQVar7,local_164);
        QSize::width((QSize *)0x6a9d7c);
        QSize::height((QSize *)0x6a9d8d);
        QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffddc.i,in_stack_fffffffffffffdd8),
                     (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),(int)in_stack_fffffffffffffdd0,
                     in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8);
        (pTVar1->maxRect).x1 = (Representation)(undefined4)local_9c;
        (pTVar1->maxRect).y1 = (Representation)local_9c._4_4_;
        (pTVar1->maxRect).x2 = (Representation)(undefined4)local_94;
        (pTVar1->maxRect).y2 = (Representation)local_94._4_4_;
        QSize::width((QSize *)0x6a9dda);
        local_a0 = QSize::height((QSize *)0x6a9df5);
        piVar12 = qMax<int>(&local_84,&local_a0);
        local_84 = *piVar12;
        local_a8 = (**(code **)(*(long *)&pQVar7->super_QWidget + 0x1a8))(pQVar7,local_164);
        local_8c = (undefined1 *)local_a8;
        QSize::width((QSize *)0x6a9e62);
        QSize::height((QSize *)0x6a9e73);
        QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffddc.i,in_stack_fffffffffffffdd8),
                     (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),(int)in_stack_fffffffffffffdd0,
                     in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8);
        (pTVar1->minRect).x1 = (Representation)(undefined4)local_b8;
        (pTVar1->minRect).y1 = (Representation)local_b8._4_4_;
        (pTVar1->minRect).x2 = (Representation)(undefined4)local_b0;
        (pTVar1->minRect).y2 = (Representation)local_b0._4_4_;
        iVar4 = QSize::width((QSize *)0x6a9ebd);
        local_15c = iVar4 + local_15c;
        pQVar9 = QList<QLayoutStruct>::operator[]
                           ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        QLayoutStruct::init(pQVar9,(EVP_PKEY_CTX *)0x0);
        iVar4 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
        ;
        pQVar9 = QList<QLayoutStruct>::operator[]
                           ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        pQVar9->sizeHint = iVar4;
        iVar4 = QSize::width((QSize *)0x6a9f2d);
        pQVar9 = QList<QLayoutStruct>::operator[]
                           ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        pQVar9->minimumSize = iVar4;
        pQVar9 = QList<QLayoutStruct>::operator[]
                           ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        pQVar9->empty = false;
        pQVar9 = QList<QLayoutStruct>::operator[]
                           ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        pQVar9->expansive = true;
        if ((*(ushort *)&in_RDI->field_0x2d0 >> 5 & 1) == 0) {
          pQVar9 = QList<QLayoutStruct>::operator[]
                             ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                              CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          iVar4 = pQVar9->sizeHint;
          pQVar9 = QList<QLayoutStruct>::operator[]
                             ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                              CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          pQVar9->maximumSize = iVar4;
        }
      }
    }
    local_54 = local_15c;
    local_58 = QSize::width((QSize *)0x6aa019);
  }
  pQVar9 = QList<QLayoutStruct>::operator[]
                     ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                      CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  QLayoutStruct::init(pQVar9,(EVP_PKEY_CTX *)0x0);
  in_stack_fffffffffffffdf0 = in_stack_fffffffffffffdf0 & 0xffffff;
  if ((*(ushort *)&in_RDI->field_0x2d0 >> 5 & 1) == 0) {
    in_stack_ffffffffffffff0c = local_5c;
    bVar3 = ::operator!=((QFlags<Qt::AlignmentFlag>)in_stack_fffffffffffffddc.i,
                         (AlignmentFlag)in_stack_fffffffffffffdd0);
    in_stack_fffffffffffffdf0 = in_stack_fffffffffffffdf0 & 0xffffff;
    if (bVar3) {
      in_stack_ffffffffffffff08 = local_5c;
      bVar3 = ::operator!=((QFlags<Qt::AlignmentFlag>)in_stack_fffffffffffffddc.i,
                           (AlignmentFlag)in_stack_fffffffffffffdd0);
      in_stack_fffffffffffffdf0 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffdf0);
    }
  }
  uVar16 = CONCAT13((char)(in_stack_fffffffffffffdf0 >> 0x18),(int3)in_stack_fffffffffffffde8);
  pQVar9 = QList<QLayoutStruct>::operator[]
                     ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                      CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  pQVar9->expansive = (bool)((byte)((uint)uVar16 >> 0x18) & 1);
  pQVar9 = QList<QLayoutStruct>::operator[]
                     ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                      CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  pQVar9->empty = true;
  qVar10 = QList<QLayoutStruct>::size(&local_78);
  iVar4 = (int)qVar10;
  qMax<int>(&local_58,&local_54);
  qGeomCalc((QList<QLayoutStruct> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
            in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
            in_stack_fffffffffffffef8,in_stack_fffffffffffffee8._12_4_);
  local_18c = 0;
  while( true ) {
    widget = (QWidget *)(long)local_18c;
    qVar10 = QList<QTabBarPrivate::Tab_*>::size(&in_RDI->tabList);
    if (qVar10 <= (long)widget) break;
    ppTVar11 = QList<QTabBarPrivate::Tab_*>::at
                         ((QList<QTabBarPrivate::Tab_*> *)in_stack_fffffffffffffdd0,
                          CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    pTVar1 = *ppTVar11;
    if (((byte)pTVar1->field_0xe4 >> 1 & 1) == 0) {
      QRect::QRect(in_stack_fffffffffffffdd0);
      (pTVar1->rect).x1 = (Representation)in_stack_fffffffffffffef8;
      (pTVar1->rect).y1 = (Representation)in_stack_fffffffffffffefc;
      (pTVar1->rect).x2 = (Representation)in_stack_ffffffffffffff00;
      (pTVar1->rect).y2 = (Representation)in_stack_ffffffffffffff04;
    }
    else {
      QList<QLayoutStruct>::at
                ((QList<QLayoutStruct> *)in_stack_fffffffffffffdd0,
                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      iVar14 = (int)((ulong)widget >> 0x20);
      if (bVar2) {
        QRect::setRect((QRect *)CONCAT44(iVar4,uVar16),iVar14,(int)widget,
                       in_stack_fffffffffffffddc.i,in_stack_fffffffffffffdd8);
      }
      else {
        QRect::setRect((QRect *)CONCAT44(iVar4,uVar16),iVar14,(int)widget,
                       in_stack_fffffffffffffddc.i,in_stack_fffffffffffffdd8);
      }
    }
    local_18c = local_18c + 1;
  }
  if ((((*(ushort *)&in_RDI->field_0x2d0 >> 3 & 1) == 0) ||
      (qVar10 = QList<QTabBarPrivate::Tab_*>::size(&in_RDI->tabList), qVar10 == 0)) ||
     (local_54 <= local_58)) {
    QWidget::hide((QWidget *)0x6aab17);
    QWidget::hide((QWidget *)0x6aab2b);
  }
  else {
    normalizedScrollRect(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
    pQVar13 = q_func(in_RDI);
    memset(local_48,0xaa,0x40);
    QStyleOption::QStyleOption
              ((QStyleOption *)CONCAT44(iVar4,uVar16),(int)((ulong)widget >> 0x20),(int)widget);
    QStyleOption::initFrom((QStyleOption *)CONCAT44(iVar4,uVar16),widget);
    pQVar8 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                           );
    (**(code **)(*(long *)pQVar8 + 0xc0))(pQVar8,0x35,local_48,pQVar13);
    pQVar8 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                           );
    (**(code **)(*(long *)pQVar8 + 0xc0))(pQVar8,0x36,local_48,pQVar13);
    pQVar8 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                           );
    (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x33,local_48,pQVar13);
    if (bVar2) {
      QRect::setHeight(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
      QRect::bottom((QRect *)0x6aa888);
      QRect::setY(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
      QRect::setHeight(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
      QToolButton::setArrowType((QToolButton *)widget,in_stack_fffffffffffffddc.i);
      QToolButton::setArrowType((QToolButton *)widget,in_stack_fffffffffffffddc.i);
      uVar15 = (undefined1)(in_stack_fffffffffffffddc.i >> 0x18);
    }
    else {
      LVar5 = QWidget::layoutDirection((QWidget *)0x6aa8f9);
      if (LVar5 == RightToLeft) {
        QRect::setWidth(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
        QRect::right((QRect *)0x6aa923);
        QRect::setX(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
        QRect::setWidth(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
        QToolButton::setArrowType((QToolButton *)widget,in_stack_fffffffffffffddc.i);
        QToolButton::setArrowType((QToolButton *)widget,in_stack_fffffffffffffddc.i);
        uVar15 = (undefined1)(in_stack_fffffffffffffddc.i >> 0x18);
      }
      else {
        QRect::setWidth(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
        QRect::right((QRect *)0x6aa9a8);
        QRect::setX(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
        QRect::setWidth(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
        QToolButton::setArrowType((QToolButton *)widget,in_stack_fffffffffffffddc.i);
        QToolButton::setArrowType((QToolButton *)widget,in_stack_fffffffffffffddc.i);
        uVar15 = (undefined1)(in_stack_fffffffffffffddc.i >> 0x18);
      }
    }
    QWidget::setGeometry
              ((QWidget *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (QRect *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    QWidget::setEnabled(widget,(bool)uVar15);
    QWidget::show(widget);
    QWidget::setGeometry
              ((QWidget *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (QRect *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    this_00 = (QStyleOption *)in_RDI->rightB;
    iVar14 = local_54;
    iVar6 = QRect::left((QRect *)0x6aaa96);
    uVar15 = (undefined1)((uint)(iVar14 + iVar6) >> 0x18);
    iVar6 = QRect::x((QRect *)0x6aaaae);
    QRect::width((QRect *)CONCAT44(iVar6,iVar14));
    QWidget::setEnabled(widget,(bool)uVar15);
    QWidget::show(widget);
    QStyleOption::~QStyleOption(this_00);
  }
  layoutWidgets((QTabBarPrivate *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                iVar4);
  (**(code **)(*(long *)&pQVar7->super_QWidget + 0x1c0))();
  QList<QLayoutStruct>::~QList((QList<QLayoutStruct> *)0x6aab5b);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabBarPrivate::layoutTabs()
{
    Q_Q(QTabBar);
    layoutDirty = false;
    QSize size = q->size();
    int last, available;
    int maxExtent;
    bool vertTabs = verticalTabs(shape);
    int tabChainIndex = 0;
    int hiddenTabs = 0;

    Qt::Alignment tabAlignment = Qt::Alignment(q->style()->styleHint(QStyle::SH_TabBar_Alignment, nullptr, q));
    QList<QLayoutStruct> tabChain(tabList.size() + 2);

    // We put an empty item at the front and back and set its expansive attribute
    // depending on tabAlignment and expanding.
    tabChain[tabChainIndex].init();
    tabChain[tabChainIndex].expansive = (!expanding)
                                        && (tabAlignment != Qt::AlignLeft)
                                        && (tabAlignment != Qt::AlignJustify);
    tabChain[tabChainIndex].empty = true;
    ++tabChainIndex;

    // We now go through our list of tabs and set the minimum size and the size hint
    // This will allow us to elide text if necessary. Since we don't set
    // a maximum size, tabs will EXPAND to fill up the empty space.
    // Since tab widget is rather *ahem* strict about keeping the geometry of the
    // tab bar to its absolute minimum, this won't bleed through, but will show up
    // if you use tab bar on its own (a.k.a. not a bug, but a feature).
    // Update: if expanding is false, we DO set a maximum size to prevent the tabs
    // being wider than necessary.
    if (!vertTabs) {
        int minx = 0;
        int x = 0;
        int maxHeight = 0;
        for (int i = 0; i < tabList.size(); ++i) {
            const auto tab = tabList.at(i);
            if (!tab->visible) {
                ++hiddenTabs;
                continue;
            }
            QSize sz = q->tabSizeHint(i);
            tab->maxRect = QRect(x, 0, sz.width(), sz.height());
            x += sz.width();
            maxHeight = qMax(maxHeight, sz.height());
            sz = q->minimumTabSizeHint(i);
            tab->minRect = QRect(minx, 0, sz.width(), sz.height());
            minx += sz.width();
            tabChain[tabChainIndex].init();
            tabChain[tabChainIndex].sizeHint = tab->maxRect.width();
            tabChain[tabChainIndex].minimumSize = sz.width();
            tabChain[tabChainIndex].empty = false;
            tabChain[tabChainIndex].expansive = true;

            if (!expanding)
                tabChain[tabChainIndex].maximumSize = tabChain[tabChainIndex].sizeHint;
            ++tabChainIndex;
        }

        last = minx;
        available = size.width();
        maxExtent = maxHeight;
    } else {
        int miny = 0;
        int y = 0;
        int maxWidth = 0;
        for (int i = 0; i < tabList.size(); ++i) {
            auto tab = tabList.at(i);
            if (!tab->visible) {
                ++hiddenTabs;
                continue;
            }
            QSize sz = q->tabSizeHint(i);
            tab->maxRect = QRect(0, y, sz.width(), sz.height());
            y += sz.height();
            maxWidth = qMax(maxWidth, sz.width());
            sz = q->minimumTabSizeHint(i);
            tab->minRect = QRect(0, miny, sz.width(), sz.height());
            miny += sz.height();
            tabChain[tabChainIndex].init();
            tabChain[tabChainIndex].sizeHint = tab->maxRect.height();
            tabChain[tabChainIndex].minimumSize = sz.height();
            tabChain[tabChainIndex].empty = false;
            tabChain[tabChainIndex].expansive = true;

            if (!expanding)
                tabChain[tabChainIndex].maximumSize = tabChain[tabChainIndex].sizeHint;
            ++tabChainIndex;
        }

        last = miny;
        available = size.height();
        maxExtent = maxWidth;
    }

    // Mirror our front item.
    tabChain[tabChainIndex].init();
    tabChain[tabChainIndex].expansive = (!expanding)
                                        && (tabAlignment != Qt::AlignRight)
                                        && (tabAlignment != Qt::AlignJustify);
    tabChain[tabChainIndex].empty = true;
    Q_ASSERT(tabChainIndex == tabChain.size() - 1 - hiddenTabs); // add an assert just to make sure.

    // Do the calculation
    qGeomCalc(tabChain, 0, tabChain.size(), 0, qMax(available, last), 0);

    // Use the results
    hiddenTabs = 0;
    for (int i = 0; i < tabList.size(); ++i) {
        auto tab = tabList.at(i);
        if (!tab->visible) {
            tab->rect = QRect();
            ++hiddenTabs;
            continue;
        }
        const QLayoutStruct &lstruct = tabChain.at(i + 1 - hiddenTabs);
        if (!vertTabs)
            tab->rect.setRect(lstruct.pos, 0, lstruct.size, maxExtent);
        else
            tab->rect.setRect(0, lstruct.pos, maxExtent, lstruct.size);
    }

    if (useScrollButtons && tabList.size() && last > available) {
        const QRect scrollRect = normalizedScrollRect(0);

        Q_Q(QTabBar);
        QStyleOption opt;
        opt.initFrom(q);
        QRect scrollButtonLeftRect = q->style()->subElementRect(QStyle::SE_TabBarScrollLeftButton, &opt, q);
        QRect scrollButtonRightRect = q->style()->subElementRect(QStyle::SE_TabBarScrollRightButton, &opt, q);
        int scrollButtonWidth = q->style()->pixelMetric(QStyle::PM_TabBarScrollButtonWidth, &opt, q);

        // Normally SE_TabBarScrollLeftButton should have the same width as PM_TabBarScrollButtonWidth.
        // But if that is not the case, we set the actual button width to PM_TabBarScrollButtonWidth, and
        // use the extra space from SE_TabBarScrollLeftButton as margins towards the tabs.
        if (vertTabs) {
            scrollButtonLeftRect.setHeight(scrollButtonWidth);
            scrollButtonRightRect.setY(scrollButtonRightRect.bottom() + 1 - scrollButtonWidth);
            scrollButtonRightRect.setHeight(scrollButtonWidth);
            leftB->setArrowType(Qt::UpArrow);
            rightB->setArrowType(Qt::DownArrow);
        } else if (q->layoutDirection() == Qt::RightToLeft) {
            scrollButtonRightRect.setWidth(scrollButtonWidth);
            scrollButtonLeftRect.setX(scrollButtonLeftRect.right() + 1 - scrollButtonWidth);
            scrollButtonLeftRect.setWidth(scrollButtonWidth);
            leftB->setArrowType(Qt::RightArrow);
            rightB->setArrowType(Qt::LeftArrow);
        } else {
            scrollButtonLeftRect.setWidth(scrollButtonWidth);
            scrollButtonRightRect.setX(scrollButtonRightRect.right() + 1 - scrollButtonWidth);
            scrollButtonRightRect.setWidth(scrollButtonWidth);
            leftB->setArrowType(Qt::LeftArrow);
            rightB->setArrowType(Qt::RightArrow);
        }

        leftB->setGeometry(scrollButtonLeftRect);
        leftB->setEnabled(false);
        leftB->show();

        rightB->setGeometry(scrollButtonRightRect);
        rightB->setEnabled(last + scrollRect.left() > scrollRect.x() + scrollRect.width());
        rightB->show();
    } else {
        rightB->hide();
        leftB->hide();
    }

    layoutWidgets();
    q->tabLayoutChange();
}